

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-value.c
# Opt level: O2

void test_value_basic(void)

{
  char cVar1;
  undefined8 uVar2;
  long lVar3;
  undefined8 uVar4;
  int iVar5;
  char *pcVar6;
  bool bVar7;
  bson_t other;
  bson_oid_t oid;
  bson_value_t copy;
  bson_iter_t iter;
  bson_t sub;
  undefined8 uStack_388;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined1 local_22c [12];
  undefined1 local_220 [32];
  undefined1 local_200 [128];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  
  local_290 = 0;
  uStack_288 = 0;
  local_2a0 = 0;
  uStack_298 = 0;
  local_2b0 = 0;
  uStack_2a8 = 0;
  local_2c0 = 0;
  uStack_2b8 = 0;
  local_2d0 = 0;
  uStack_2c8 = 0;
  local_2e0 = 0;
  uStack_2d8 = 0;
  local_2f0 = 0;
  uStack_2e8 = 0;
  local_300 = 0x500000003;
  uStack_2f8 = 5;
  local_110 = 0;
  uStack_108 = 0;
  local_120 = 0;
  uStack_118 = 0;
  local_130 = 0;
  uStack_128 = 0;
  local_140 = 0;
  uStack_138 = 0;
  local_150 = 0;
  uStack_148 = 0;
  local_160 = 0;
  uStack_158 = 0;
  local_170 = 0;
  uStack_168 = 0;
  local_180 = 0x500000003;
  uStack_178 = 5;
  bson_oid_init(local_22c,0);
  uVar2 = bson_bcon_magic();
  uVar2 = bcon_new(0x9999999a,0,"double",uVar2,1,"utf8","this is my string","document",uVar2,2,
                   &local_180,"array",uVar2,2,&local_180,"binary",uVar2,4,0,"",0x10,"undefined",
                   uVar2,5,"oid",uVar2,6,local_22c,"bool",uVar2,7,1,"datetime",uVar2,8,0xbc614e,
                   "null",uVar2,9,"regex",uVar2,10,"^hello","i","dbpointer",uVar2,0xb,"test.test",
                   local_22c,"code",uVar2,0xc,"var a = function() {}","symbol",uVar2,0xd,"my_symbol"
                   ,"codewscope",uVar2,0xe,"var a = 1;",&local_180,"int32",uVar2,0xf,0x4d2,
                   "timestamp",uVar2,0x10);
  cVar1 = bson_iter_init(local_200,uVar2);
  if (cVar1 == '\0') {
    pcVar6 = "r";
    uStack_388 = 0x52;
  }
  else {
    iVar5 = 0x14;
    while( true ) {
      cVar1 = bson_iter_next(local_200);
      bVar7 = iVar5 == 0;
      iVar5 = iVar5 + -1;
      if (bVar7) break;
      if (cVar1 == '\0') {
        pcVar6 = "r";
        uStack_388 = 0x56;
        goto LAB_0012d160;
      }
      lVar3 = bson_iter_value(local_200);
      if (lVar3 == 0) {
        pcVar6 = "value";
        uStack_388 = 0x59;
        goto LAB_0012d160;
      }
      bson_value_copy(lVar3,local_220);
      uVar4 = bson_iter_key(local_200);
      cVar1 = bson_append_value(&local_300,uVar4,0xffffffff,local_220);
      if (cVar1 == '\0') {
        pcVar6 = "r";
        uStack_388 = 0x5e;
        goto LAB_0012d160;
      }
      bson_value_destroy(local_220);
    }
    if (cVar1 == '\0') {
      bson_destroy(uVar2);
      bson_destroy(&local_300);
      return;
    }
    pcVar6 = "!r";
    uStack_388 = 100;
  }
LAB_0012d160:
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-value.c",
          uStack_388,"test_value_basic",pcVar6);
  abort();
}

Assistant:

static void
test_value_basic (void)
{
   static const uint8_t raw[16] = {0};
   const bson_value_t *value;
   bson_value_t copy;
   bson_iter_t iter;
   bson_oid_t oid;
   bson_t other = BSON_INITIALIZER;
   bson_t *doc;
   bson_t sub = BSON_INITIALIZER;
   bool r;
   int i;

   bson_oid_init (&oid, NULL);

   doc = BCON_NEW ("double",
                   BCON_DOUBLE (123.4),
                   "utf8",
                   "this is my string",
                   "document",
                   BCON_DOCUMENT (&sub),
                   "array",
                   BCON_DOCUMENT (&sub),
                   "binary",
                   BCON_BIN (BSON_SUBTYPE_BINARY, raw, sizeof raw),
                   "undefined",
                   BCON_UNDEFINED,
                   "oid",
                   BCON_OID (&oid),
                   "bool",
                   BCON_BOOL (true),
                   "datetime",
                   BCON_DATE_TIME (12345678),
                   "null",
                   BCON_NULL,
                   "regex",
                   BCON_REGEX ("^hello", "i"),
                   "dbpointer",
                   BCON_DBPOINTER ("test.test", &oid),
                   "code",
                   BCON_CODE ("var a = function() {}"),
                   "symbol",
                   BCON_SYMBOL ("my_symbol"),
                   "codewscope",
                   BCON_CODEWSCOPE ("var a = 1;", &sub),
                   "int32",
                   BCON_INT32 (1234),
                   "timestamp",
                   BCON_TIMESTAMP (1234, 4567),
                   "int64",
                   BCON_INT32 (4321),
                   "maxkey",
                   BCON_MAXKEY,
                   "minkey",
                   BCON_MINKEY);

   r = bson_iter_init (&iter, doc);
   BSON_ASSERT (r);

   for (i = 0; i < 20; i++) {
      r = bson_iter_next (&iter);
      BSON_ASSERT (r);

      value = bson_iter_value (&iter);
      BSON_ASSERT (value);

      bson_value_copy (value, &copy);

      r = bson_append_value (&other, bson_iter_key (&iter), -1, &copy);
      BSON_ASSERT (r);

      bson_value_destroy (&copy);
   }

   r = bson_iter_next (&iter);
   BSON_ASSERT (!r);

   bson_destroy (doc);
   bson_destroy (&other);
}